

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

int uECC_valid_public_key(uint8_t *public_key)

{
  cmpresult_t cVar1;
  undefined1 local_98 [8];
  EccPoint public;
  uECC_word_t tmp2 [4];
  uECC_word_t tmp1 [4];
  uint8_t *public_key_local;
  
  vli_bytesToNative((uint64_t *)local_98,public_key);
  vli_bytesToNative(public.x + 3,public_key + 0x20);
  cVar1 = EccPoint_isZero((EccPoint *)local_98);
  if (((cVar1 == 0) && (cVar1 = vli_cmp(curve_p,(uECC_word_t *)local_98), cVar1 == 1)) &&
     (cVar1 = vli_cmp(curve_p,public.x + 3), cVar1 == 1)) {
    vli_modSquare_fast(tmp2 + 3,public.x + 3);
    curve_x_side(public.y + 3,(uECC_word_t *)local_98);
    cVar1 = vli_cmp(tmp2 + 3,public.y + 3);
    return (uint)(cVar1 == 0);
  }
  return 0;
}

Assistant:

int uECC_valid_public_key(const uint8_t public_key[uECC_BYTES*2]) {
    uECC_word_t tmp1[uECC_WORDS];
    uECC_word_t tmp2[uECC_WORDS];
    EccPoint public;

    vli_bytesToNative(public.x, public_key);
    vli_bytesToNative(public.y, public_key + uECC_BYTES);

    // The point at infinity is invalid.
    if (EccPoint_isZero(&public)) {
        return 0;
    }

    // x and y must be smaller than p.
    if (vli_cmp(curve_p, public.x) != 1 || vli_cmp(curve_p, public.y) != 1) {
        return 0;
    }

    vli_modSquare_fast(tmp1, public.y); /* tmp1 = y^2 */
    curve_x_side(tmp2, public.x); /* tmp2 = x^3 + ax + b */

    /* Make sure that y^2 == x^3 + ax + b */
    return (vli_cmp(tmp1, tmp2) == 0);
}